

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lyd_node *data_tree,lyd_node *act_notif,
              unres_data *unres)

{
  LYS_NODE LVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lyd_node **pplVar4;
  lyd_node **pplVar5;
  undefined8 uVar6;
  lys_node *schema;
  lyd_node *plVar7;
  lyd_node *first;
  char *format;
  lyd_node *plVar8;
  lyd_node *plVar9;
  lyd_node *plVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  lyd_node *local_68;
  lyd_node *act_notif_local;
  lyd_node **local_58;
  ly_ctx *local_50;
  unres_data *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  local_68 = act_notif;
  if (((((uint)options >> 8 & 1) != 0) || (root == (lyd_node **)0x0)) ||
     (unres == (unres_data *)0x0)) {
    __assert_fail("root && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1872,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if ((data_tree != (lyd_node *)0x0) && (data_tree->prev->next != (lyd_node *)0x0)) {
    __assert_fail("!data_tree || !data_tree->prev->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1873,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                 );
  }
  if ((((uint)options >> 0xc & 1) != 0) && (*root == (lyd_node *)0x0)) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    format = "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.";
    goto LAB_00160b39;
  }
  plVar10 = *root;
  if ((options & 0x70U) == 0) {
    if (plVar10 != (lyd_node *)0x0) {
      if (plVar10->parent != (lyd_node *)0x0) {
        ctx = (ly_ctx *)0x0;
        options = options | 0x1000;
      }
    }
  }
  else {
    if (plVar10 == (lyd_node *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      format = 
      "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
      ;
      goto LAB_00160b39;
    }
    if ((act_notif == (lyd_node *)0x0 && (options & 0x10U) != 0) &&
       (plVar10->schema->nodetype != LYS_RPC)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      format = "Not valid RPC/action data.";
      goto LAB_00160b39;
    }
    if (((options & 0x20U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar10->schema->nodetype != LYS_RPC)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      format = "Not valid reply data.";
      goto LAB_00160b39;
    }
    if (((options & 0x40U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar10->schema->nodetype != LYS_NOTIF)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      format = "Not valid notification data.";
      goto LAB_00160b39;
    }
  }
  pplVar5 = &local_68;
  if (act_notif == (lyd_node *)0x0) {
    pplVar5 = root;
  }
  if (((uint)options >> 8 & 1) != 0) {
    __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1829,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  plVar10 = *pplVar5;
  if (ctx == (ly_ctx *)0x0 && plVar10 == (lyd_node *)0x0) {
    __assert_fail("*root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x182a,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  local_58 = root;
  local_40 = data_tree;
  if (((uint)options >> 0xc & 1) != 0 && plVar10 == (lyd_node *)0x0) {
    __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x182b,
                  "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, struct unres_data *, int)");
  }
  local_48 = unres;
  if ((options & 0xeU) == 0) {
    if (ctx == (ly_ctx *)0x0) {
      ctx = plVar10->schema->module->ctx;
    }
    if ((options & 0xf1U) == 0 || (options & 1U) != 0) {
      if (((uint)options >> 0xc & 1) != 0) {
        iVar2 = lyd_wd_add_subtree(pplVar5,(lyd_node *)0x0,(lyd_node *)0x0,plVar10->schema,1,options
                                   ,unres);
        goto LAB_00160a73;
      }
      iVar2 = (ctx->models).used;
      local_50 = ctx;
      if (0 < iVar2) {
        lVar11 = 0;
        do {
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar2);
      }
    }
    else if ((options & 0x40U) == 0) {
      if ((options & 0x30U) == 0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        uVar6 = 0x1864;
        goto LAB_0016092b;
      }
      if ((plVar10 == (lyd_node *)0x0) ||
         ((plVar10->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINVAL;
        format = "Subtree is not a single RPC/action/reply.";
        goto LAB_00160b39;
      }
      schema = plVar10->schema->child;
      if ((options & 0x10U) == 0) {
        for (; schema != (lys_node *)0x0; schema = schema->next) {
          if (schema->nodetype == LYS_OUTPUT) goto LAB_00160a2c;
        }
      }
      else {
        for (; schema != (lys_node *)0x0; schema = schema->next) {
          if (schema->nodetype == LYS_INPUT) goto LAB_00160a2c;
        }
      }
    }
    else {
      if ((plVar10 == (lyd_node *)0x0) || (schema = plVar10->schema, schema->nodetype != LYS_NOTIF))
      {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINVAL;
        format = "Subtree is not a single notification.";
LAB_00160b39:
        ly_log(LY_LLERR,format);
        return 1;
      }
LAB_00160a2c:
      iVar2 = lyd_wd_add_subtree(pplVar5,plVar10,plVar10,schema,0,options,unres);
LAB_00160a73:
      if (iVar2 != 0) {
        return 1;
      }
    }
  }
  if (local_48->count == 0) {
    return 0;
  }
  plVar10 = *local_58;
  if (plVar10 != (lyd_node *)0x0) {
    bVar13 = (options & 0x70U) == 0;
    local_50 = (ly_ctx *)CONCAT71(local_50._1_7_,bVar13 || local_40 == (lyd_node *)0x0);
    if (bVar13 || local_40 == (lyd_node *)0x0) {
      plVar10 = (lyd_node *)0x0;
      local_40 = (lyd_node *)0x0;
      first = (lyd_node *)0x0;
      plVar7 = (lyd_node *)0x0;
      pplVar5 = local_58;
    }
    else {
      if (local_68 == (lyd_node *)0x0) {
        local_38 = (lyd_node *)0x0;
        first = (lyd_node *)0x0;
        plVar9 = local_40;
      }
      else {
        if (local_68->parent == (lyd_node *)0x0) {
          __assert_fail("act_notif->parent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x18a3,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                       );
        }
        act_notif_local = (lyd_node *)0x0;
        plVar8 = local_40;
        plVar7 = (lyd_node *)0x0;
        plVar9 = plVar10;
        do {
          while ((first = plVar8, first->schema == plVar9->schema &&
                 ((plVar9->schema->nodetype != LYS_LIST ||
                  (iVar2 = lyd_list_equal(first,plVar9,0,0,0), iVar2 != 0))))) {
            plVar8 = first->child;
            plVar7 = plVar9->child;
            local_38 = plVar9;
            if (plVar9->child == (lyd_node *)0x0) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x18bc);
              uVar12 = 1;
              plVar7 = act_notif_local;
              plVar10 = local_38;
              goto LAB_00160bac;
            }
            while (plVar10 = plVar7, LVar1 = plVar10->schema->nodetype, LVar1 == LYS_LEAF) {
              plVar7 = plVar10->next;
              if (plVar10->next == (lyd_node *)0x0) {
                pLVar3 = ly_errno_location();
                *pLVar3 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                       ,0x18c4);
                uVar12 = 1;
                plVar7 = local_38;
                goto LAB_00160bac;
              }
            }
            if ((LVar1 & (LYS_ACTION|LYS_NOTIF)) != LYS_UNKNOWN) {
              if (local_68->parent->schema != first->schema) {
                __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                              ,0x18ca,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                             );
              }
              if (plVar10 != local_68) {
                __assert_fail("msg_sibling == act_notif",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                              ,0x18cb,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                             );
              }
              goto LAB_00160aa9;
            }
            act_notif_local = plVar9;
            plVar7 = first;
            plVar9 = plVar10;
            if (plVar8 == (lyd_node *)0x0) goto LAB_00160aa5;
          }
          pplVar5 = &first->next;
          first = plVar7;
          plVar8 = *pplVar5;
          plVar10 = plVar9;
        } while (*pplVar5 != (lyd_node *)0x0);
LAB_00160aa5:
        plVar8 = (lyd_node *)0x0;
        local_38 = act_notif_local;
LAB_00160aa9:
        plVar9 = local_40;
        if (first != (lyd_node *)0x0) {
          plVar9 = plVar8;
        }
      }
      pplVar5 = local_58;
      lyd_unlink_internal(plVar10,0);
      if (first == (lyd_node *)0x0 && plVar9 == (lyd_node *)0x0) {
        __assert_fail("data_tree_parent || data_tree_sibling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,0x18e1,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                     );
      }
      plVar7 = local_38;
      local_40 = plVar9;
      if (first == (lyd_node *)0x0) {
        if (plVar9->parent != (lyd_node *)0x0) {
          __assert_fail("!data_tree_sibling->parent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x18ee,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                       );
        }
        plVar8 = plVar9->prev;
        plVar10->prev = plVar8;
        plVar8->next = plVar10;
        plVar9->prev = plVar10;
        first = (lyd_node *)0x0;
      }
      else {
        plVar8 = first->child;
        if (plVar8 == (lyd_node *)0x0) {
          pplVar4 = &first->child;
        }
        else {
          plVar9 = plVar8->prev;
          pplVar4 = &plVar8->prev;
          plVar9->next = plVar10;
          plVar10->prev = plVar9;
        }
        *pplVar4 = plVar10;
        plVar10->parent = first;
      }
    }
    iVar2 = resolve_unres_data(local_48,pplVar5,options);
    uVar12 = (uint)(iVar2 != 0);
    plVar8 = local_40;
LAB_00160bac:
    if ((char)local_50 != '\0') {
      return uVar12;
    }
    if (first == (lyd_node *)0x0) {
      if (plVar8->prev != plVar10) {
        __assert_fail("data_tree_sibling->prev == msg_sibling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,0x1907,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                     );
      }
      plVar9 = plVar10->prev;
      plVar8->prev = plVar9;
      plVar9->next = (lyd_node *)0x0;
      plVar10->prev = plVar10;
    }
    else {
      if (first->child->prev != plVar10) {
        __assert_fail("data_tree_parent->child->prev == msg_sibling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                      ,0x1901,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lyd_node *, struct lyd_node *, struct unres_data *)"
                     );
      }
      plVar8 = plVar10->prev;
      first->child->prev = plVar8;
      plVar8->next = (lyd_node *)0x0;
      plVar10->prev = plVar10;
      plVar10->parent = (lyd_node *)0x0;
    }
    if (plVar7 != (lyd_node *)0x0) {
      plVar8 = plVar7->child;
      if (plVar8 == (lyd_node *)0x0) {
        pplVar5 = &plVar7->child;
      }
      else {
        plVar9 = plVar8->prev;
        pplVar5 = &plVar8->prev;
        plVar9->next = plVar10;
        plVar10->prev = plVar9;
      }
      *pplVar5 = plVar10;
      plVar10->parent = plVar7;
      return uVar12;
    }
    return uVar12;
  }
  pLVar3 = ly_errno_location();
  *pLVar3 = LY_EINT;
  uVar6 = 0x189b;
LAB_0016092b:
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c",
         uVar6);
  return 1;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lyd_node *data_tree,
                       struct lyd_node *act_notif, struct unres_data *unres)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling = NULL, *data_tree_parent = NULL;
    int ret = EXIT_FAILURE;

    assert(root && unres && !(options & LYD_OPT_ACT_NOTIF));
    assert(!data_tree || !data_tree->prev->next);

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
        ctx = NULL;
    }

    /* add missing default nodes */
    if (lyd_wd_add((act_notif ? &act_notif : root), ctx, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT;
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            if (act_notif) {
                /* fun case */
                assert(act_notif->parent);

                msg_parent = NULL;
                msg_sibling = *root;
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0, 0, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        if (!msg_sibling->child) {
                            LOGINT;
                            goto unlink_datatree;
                        }
                        msg_parent = msg_sibling;
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            if (!msg_sibling->next) {
                                LOGINT;
                                goto unlink_datatree;
                            }
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                msg_sibling = *root;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can link msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (!data_tree_parent->child) {
                    data_tree_parent->child = msg_sibling;
                } else {
                    /* last child of data_tree_parent */
                    data_tree_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = data_tree_parent->child->prev;
                    data_tree_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = data_tree_parent;
            } else {
                /* last sibling of data_tree_sibling */
                assert(!data_tree_sibling->parent);
                msg_sibling->prev = data_tree_sibling->prev;
                data_tree_sibling->prev->next = msg_sibling;
                data_tree_sibling->prev = msg_sibling;
            }
        }

        if (resolve_unres_data(unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink it back */
            if (data_tree_parent) {
                assert(data_tree_parent->child->prev == msg_sibling);
                data_tree_parent->child->prev = msg_sibling->prev;
                data_tree_parent->child->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
                msg_sibling->parent = NULL;
            } else {
                assert(data_tree_sibling->prev == msg_sibling);
                data_tree_sibling->prev = msg_sibling->prev;
                data_tree_sibling->prev->next = NULL;
                msg_sibling->prev = msg_sibling;
            }

            /* link it back, if there is a parent to link to */
            if (msg_parent) {
                /* it must always be last */
                if (!msg_parent->child) {
                    msg_parent->child = msg_sibling;
                } else {
                    msg_parent->child->prev->next = msg_sibling;
                    msg_sibling->prev = msg_parent->child->prev;
                    msg_parent->child->prev = msg_sibling;
                }
                msg_sibling->parent = msg_parent;
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}